

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

void Abc_NtkFinMiterCollect(Abc_Ntk_t *pNtk,Vec_Int_t *vCos,Vec_Int_t *vCis,Vec_Int_t *vNodes)

{
  int i;
  Abc_Obj_t *pAVar1;
  int iVar2;
  
  vCis->nSize = 0;
  vNodes->nSize = 0;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    Vec_IntFill(&pNtk->vTravIds,pNtk->vObjs->nSize + 500,0);
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    for (iVar2 = 0; iVar2 < vCos->nSize; iVar2 = iVar2 + 1) {
      i = Vec_IntEntry(vCos,iVar2);
      pAVar1 = Abc_NtkObj(pNtk,i);
      if (pAVar1 != (Abc_Obj_t *)0x0) {
        Abc_NtkFinMiterCollect_rec
                  ((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray],vCis,vNodes);
      }
    }
    return;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkFinMiterCollect( Abc_Ntk_t * pNtk, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pObj; int i;
    Vec_IntClear( vCis );
    Vec_IntClear( vNodes );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachObjVec( vCos, pNtk, pObj, i )
        Abc_NtkFinMiterCollect_rec( Abc_ObjFanin0(pObj), vCis, vNodes );
}